

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

bool __thiscall Minisat::Solver::binResMinimize(Solver *this,vec<Minisat::Lit> *out_learnt)

{
  uint64_t *puVar1;
  unsigned_long *puVar2;
  Lit *pLVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  unsigned_long uVar7;
  int iVar8;
  long lVar9;
  int i_2;
  int iVar10;
  int iVar11;
  vec<Minisat::Watcher> *pvVar12;
  int i_1;
  lbool local_39;
  vec<Minisat::Lit> *local_38;
  
  puVar2 = (this->seen2).data;
  uVar7 = this->counter + 1;
  this->counter = uVar7;
  iVar8 = out_learnt->sz;
  pLVar3 = out_learnt->data;
  for (lVar9 = 1; lVar9 < iVar8; lVar9 = lVar9 + 1) {
    puVar2[pLVar3[lVar9].x >> 1] = uVar7;
  }
  pvVar12 = (this->watches_bin).occs.data + ((long)pLVar3->x ^ 1);
  puVar1 = &(this->statistics).solveSteps;
  *puVar1 = *puVar1 + 1;
  iVar8 = 0;
  local_38 = out_learnt;
  for (lVar9 = 0; lVar9 < pvVar12->sz; lVar9 = lVar9 + 1) {
    iVar5 = pvVar12->data[lVar9].blocker.x;
    iVar6 = iVar5 >> 1;
    if ((this->seen2).data[iVar6] == this->counter) {
      local_39.value = (byte)iVar5 & 1 ^ (this->assigns).data[iVar6].value;
      bVar4 = lbool::operator==(&local_39,(lbool)0x0);
      if (bVar4) {
        iVar8 = iVar8 + 1;
        (this->seen2).data[iVar6] = this->counter - 1;
      }
    }
  }
  if (0 < iVar8) {
    iVar6 = local_38->sz;
    iVar5 = iVar6 + -1;
    pLVar3 = local_38->data;
    puVar2 = (this->seen2).data;
    uVar7 = this->counter;
    iVar11 = 1;
    while (iVar11 < iVar6 - iVar8) {
      iVar10 = iVar11;
      if (puVar2[pLVar3[iVar11].x >> 1] != uVar7) {
        lVar9 = (long)iVar5;
        iVar5 = iVar5 + -1;
        iVar10 = iVar11 + -1;
        pLVar3[iVar11].x = pLVar3[lVar9].x;
        iVar6 = local_38->sz;
      }
      iVar11 = iVar10 + 1;
    }
    vec<Minisat::Lit>::shrink(local_38,iVar8);
  }
  return iVar8 != 0;
}

Assistant:

bool Solver::binResMinimize(vec<Lit> &out_learnt)
{
    // Preparation: remember which false variables we have in 'out_learnt'.
    counter++;
    for (int i = 1; i < out_learnt.size(); i++) seen2[var(out_learnt[i])] = counter;

    // Get the list of binary clauses containing 'out_learnt[0]'.
    const vec<Watcher> &ws = watches_bin[~out_learnt[0]];
    statistics.solveSteps++;

    int to_remove = 0;
    for (int i = 0; i < ws.size(); i++) {
        Lit the_other = ws[i].blocker;
        // Does 'the_other' appear negatively in 'out_learnt'?
        if (seen2[var(the_other)] == counter && value(the_other) == l_True) {
            to_remove++;
            seen2[var(the_other)] = counter - 1; // Remember to remove this variable.
        }
    }

    // Shrink.
    if (to_remove > 0) {
        int last = out_learnt.size() - 1;
        for (int i = 1; i < out_learnt.size() - to_remove; i++)
            if (seen2[var(out_learnt[i])] != counter) out_learnt[i--] = out_learnt[last--];
        out_learnt.shrink(to_remove);
    }
    return to_remove != 0;
}